

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

void __thiscall
Js::RecyclableMethodsGroupWalker::AddItem
          (RecyclableMethodsGroupWalker *this,PropertyId propertyId,Var obj)

{
  int iVar1;
  ArenaAllocator *pAVar2;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar3;
  DebuggerPropertyDisplayInfo *pDVar4;
  
  if ((this->super_RecyclableObjectWalker).pMembersList ==
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    pAVar2 = GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext);
    pLVar3 = (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)new<Memory::ArenaAllocator>(0x30,pAVar2,0x364470);
    (pLVar3->
    super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
    alloc = pAVar2;
    (pLVar3->
    super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014e4370;
    (pLVar3->
    super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
    buffer = (Type)0x0;
    (pLVar3->
    super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
    count = 0;
    pLVar3->length = 0;
    pLVar3->increment = 4;
    (this->super_RecyclableObjectWalker).pMembersList = pLVar3;
  }
  pAVar2 = GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext);
  pDVar4 = (DebuggerPropertyDisplayInfo *)new<Memory::ArenaAllocator>(0x18,pAVar2,0x364470);
  pDVar4->propId = propertyId;
  pDVar4->aVar = obj;
  pDVar4->flags = 1;
  pLVar3 = (this->super_RecyclableObjectWalker).pMembersList;
  JsUtil::
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(pLVar3,0);
  iVar1 = (pLVar3->
          super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
          ).count;
  (pLVar3->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  buffer[iVar1] = pDVar4;
  (pLVar3->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  count = iVar1 + 1;
  return;
}

Assistant:

void RecyclableMethodsGroupWalker::AddItem(Js::PropertyId propertyId, Var obj)
    {
        if (pMembersList == nullptr)
        {
            pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
        }

        Assert(pMembersList);

        DebuggerPropertyDisplayInfo *info = Anew(GetArenaFromContext(scriptContext), DebuggerPropertyDisplayInfo, propertyId, obj, DebuggerPropertyDisplayInfoFlags_Const);
        Assert(info);
        pMembersList->Add(info);
    }